

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonObject.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall Json::JsonObject::toList_abi_cxx11_(JsonObject *this)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  pointer pjVar5;
  element_type *peVar6;
  element_type *peVar7;
  undefined4 extraout_var;
  reference __x;
  allocator<char> local_111;
  value_type local_110;
  allocator<char> local_e9;
  value_type local_e8;
  ulong local_c8;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  x;
  value_type local_a0;
  value_type local_80;
  __normal_iterator<Json::JsonObject::json_object_element_t_*,_std::vector<Json::JsonObject::json_object_element_t,_std::allocator<Json::JsonObject::json_object_element_t>_>_>
  local_60;
  __normal_iterator<Json::JsonObject::json_object_element_t_*,_std::vector<Json::JsonObject::json_object_element_t,_std::allocator<Json::JsonObject::json_object_element_t>_>_>
  local_58;
  iterator iter;
  int local_48;
  int __size;
  int __index;
  allocator<char> local_31;
  value_type local_30;
  JsonObject *local_10;
  JsonObject *this_local;
  
  local_10 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->__lstJsonText);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,1,'{',&local_31);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->__lstJsonText,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  local_48 = 0;
  sVar4 = std::
          vector<Json::JsonObject::json_object_element_t,_std::allocator<Json::JsonObject::json_object_element_t>_>
          ::size(&this->__mpJsonObject);
  iter._M_current._4_4_ = (int)sVar4;
  local_58._M_current =
       (json_object_element_t *)
       std::
       vector<Json::JsonObject::json_object_element_t,_std::allocator<Json::JsonObject::json_object_element_t>_>
       ::begin(&this->__mpJsonObject);
  while( true ) {
    local_60._M_current =
         (json_object_element_t *)
         std::
         vector<Json::JsonObject::json_object_element_t,_std::allocator<Json::JsonObject::json_object_element_t>_>
         ::end(&this->__mpJsonObject);
    bVar2 = __gnu_cxx::operator!=(&local_58,&local_60);
    if (!bVar2) break;
    pjVar5 = __gnu_cxx::
             __normal_iterator<Json::JsonObject::json_object_element_t_*,_std::vector<Json::JsonObject::json_object_element_t,_std::allocator<Json::JsonObject::json_object_element_t>_>_>
             ::operator->(&local_58);
    peVar6 = std::__shared_ptr_access<Json::JsonString,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Json::JsonString,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pjVar5);
    (*(peVar6->super_JsonValue)._vptr_JsonValue[1])();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->__lstJsonText,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,1,':',
               (allocator<char> *)
               ((long)&x.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->__lstJsonText,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&x.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pjVar5 = __gnu_cxx::
             __normal_iterator<Json::JsonObject::json_object_element_t_*,_std::vector<Json::JsonObject::json_object_element_t,_std::allocator<Json::JsonObject::json_object_element_t>_>_>
             ::operator->(&local_58);
    peVar7 = std::__shared_ptr_access<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pjVar5->value);
    iVar3 = (*peVar7->_vptr_JsonValue[10])();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(extraout_var,iVar3));
    local_c8 = 0;
    while( true ) {
      uVar1 = local_c8;
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&i);
      if (sVar4 <= uVar1) break;
      __x = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i,local_c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->__lstJsonText,__x);
      local_c8 = local_c8 + 1;
    }
    local_48 = local_48 + 1;
    if (local_48 < iter._M_current._4_4_) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,1,',',&local_e9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->__lstJsonText,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_e9);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i);
    __gnu_cxx::
    __normal_iterator<Json::JsonObject::json_object_element_t_*,_std::vector<Json::JsonObject::json_object_element_t,_std::allocator<Json::JsonObject::json_object_element_t>_>_>
    ::operator++(&local_58);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,1,'}',&local_111);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->__lstJsonText,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  return &this->__lstJsonText;
}

Assistant:

const std::vector<std::string> &Json::JsonObject::toList() {
    __lstJsonText.clear();
    __lstJsonText.push_back(_JSCS(JSON_OBJECT_BEGIN));
    int __index = 0, __size = __mpJsonObject.size();
    for (auto iter = __mpJsonObject.begin(); iter != __mpJsonObject.end(); ++iter) {
        __lstJsonText.push_back(iter->key->toString());
        __lstJsonText.push_back(_JSCS(JSON_OBJ_SEPARATE));
        auto x = iter->value->toList();
        for (size_t i = 0; i < x.size(); ++i) __lstJsonText.push_back(x.at(i));
        __index++;
        if (__index < __size) __lstJsonText.push_back(_JSCS(JSON_SEPARATE));
    }
    __lstJsonText.push_back(_JSCS(JSON_OBJECT_END));
    return __lstJsonText;
}